

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O3

int __thiscall
beagle::cpu::BeagleCPUImpl<double,_1,_0>::setPartials
          (BeagleCPUImpl<double,_1,_0> *this,int bufferIndex,double *inPartials)

{
  double **ppdVar1;
  int iVar2;
  int iVar3;
  double *pdVar4;
  int iVar5;
  double *__dest;
  int iVar6;
  long lVar7;
  uint uVar8;
  
  iVar6 = -5;
  if ((-1 < bufferIndex) && (bufferIndex < *(int *)&(this->super_BeagleImpl).field_0xc)) {
    ppdVar1 = this->gPartials;
    pdVar4 = ppdVar1[(uint)bufferIndex];
    if (pdVar4 == (double *)0x0) {
      pdVar4 = (double *)malloc((long)this->kPartialsSize << 3);
      ppdVar1[(uint)bufferIndex] = pdVar4;
      pdVar4 = this->gPartials[(uint)bufferIndex];
      if (pdVar4 == (double *)0x0) {
        return -2;
      }
    }
    if (0 < this->kCategoryCount) {
      iVar6 = this->kPatternCount;
      iVar3 = 0;
      do {
        if (iVar6 < 1) {
          iVar2 = this->kPartialsPaddedStateCount;
        }
        else {
          uVar8 = this->kStateCount;
          iVar5 = 0;
          __dest = pdVar4;
          do {
            memcpy(__dest,inPartials,(ulong)uVar8 << 3);
            uVar8 = this->kStateCount;
            iVar2 = this->kPartialsPaddedStateCount;
            lVar7 = (long)(int)uVar8;
            pdVar4 = __dest + lVar7;
            if ((int)uVar8 < iVar2) {
              memset(pdVar4,0,(ulong)(~uVar8 + iVar2) * 8 + 8);
              pdVar4 = __dest + (ulong)(~uVar8 + iVar2) + lVar7 + 1;
            }
            inPartials = inPartials + lVar7;
            iVar5 = iVar5 + 1;
            iVar6 = this->kPatternCount;
            __dest = pdVar4;
          } while (iVar5 < iVar6);
        }
        uVar8 = (this->kPaddedPatternCount - iVar6) * iVar2;
        if (0 < (int)uVar8) {
          memset(pdVar4,0,(ulong)uVar8 << 3);
          pdVar4 = pdVar4 + (ulong)(uVar8 - 1) + 1;
        }
        iVar3 = iVar3 + 1;
      } while (iVar3 < this->kCategoryCount);
    }
    iVar6 = 0;
  }
  return iVar6;
}

Assistant:

BEAGLE_CPU_TEMPLATE
int BeagleCPUImpl<BEAGLE_CPU_GENERIC>::setPartials(int bufferIndex,
                               const double* inPartials) {
    if (bufferIndex < 0 || bufferIndex >= kBufferCount)
        return BEAGLE_ERROR_OUT_OF_RANGE;
    if (gPartials[bufferIndex] == NULL) {
        gPartials[bufferIndex] = (REALTYPE*) malloc(sizeof(REALTYPE) * kPartialsSize);
        if (gPartials[bufferIndex] == 0L)
            return BEAGLE_ERROR_OUT_OF_MEMORY;
    }

    const double* inPartialsOffset = inPartials;
    REALTYPE* tmpRealPartialsOffset = gPartials[bufferIndex];
    for (int l = 0; l < kCategoryCount; l++) {
        for (int i = 0; i < kPatternCount; i++) {
            beagleMemCpy(tmpRealPartialsOffset, inPartialsOffset, kStateCount);
            tmpRealPartialsOffset += kStateCount;
            // Pad extra buffer with zeros
            for(int k = kStateCount; k < kPartialsPaddedStateCount; k++) {
                *tmpRealPartialsOffset++ = 0;
            }
            inPartialsOffset += kStateCount;
        }
        // Pad extra buffer with zeros
        for(int k = 0; k < kPartialsPaddedStateCount * (kPaddedPatternCount - kPatternCount); k++) {
            *tmpRealPartialsOffset++ = 0;
        }
    }

    return BEAGLE_SUCCESS;
}